

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O2

void write_pile(ang_file *fff)

{
  object_kind *poVar1;
  
  file_putf(fff,"Pile integrity failure at %s:%d\n\n",fail_file,(ulong)(uint)fail_line);
  file_putf(fff,"Guilty object\n=============\n");
  if ((fail_object != (object *)0x0) && (fail_object->kind != (object_kind *)0x0)) {
    file_putf(fff,"Name: %s\n",fail_object->kind->name);
    if (fail_prev == true) {
      file_putf(fff,"Previous: ");
      if ((fail_object->prev == (object *)0x0) ||
         (poVar1 = fail_object->prev->kind, poVar1 == (object_kind *)0x0)) {
        file_putf(fff,"bad object\n");
      }
      else {
        file_putf(fff,"%s\n",poVar1->name);
      }
    }
    if (fail_next == true) {
      file_putf(fff,"Next: ");
      if ((fail_object->next == (object *)0x0) ||
         (poVar1 = fail_object->next->kind, poVar1 == (object_kind *)0x0)) {
        file_putf(fff,"bad object\n");
      }
      else {
        file_putf(fff,"%s\n",poVar1->name);
      }
    }
    file_putf(fff,"\n");
  }
  if (fail_pile != (object *)0x0) {
    file_putf(fff,"Guilty pile\n=============\n");
    for (; fail_pile != (object *)0x0; fail_pile = fail_pile->next) {
      if (fail_pile->kind == (object_kind *)0x0) {
        file_putf(fff,"bad object\n");
      }
      else {
        file_putf(fff,"Name: %s\n",fail_pile->kind->name);
      }
    }
  }
  return;
}

Assistant:

static void write_pile(ang_file *fff)
{
	file_putf(fff, "Pile integrity failure at %s:%d\n\n", fail_file, fail_line);
	file_putf(fff, "Guilty object\n=============\n");
	if (fail_object && fail_object->kind) {
		file_putf(fff, "Name: %s\n", fail_object->kind->name);
		if (fail_prev) {
			file_putf(fff, "Previous: ");
			if (fail_object->prev && fail_object->prev->kind) {
				file_putf(fff, "%s\n", fail_object->prev->kind->name);
			} else {
				file_putf(fff, "bad object\n");
			}
		}
		if (fail_next) {
			file_putf(fff, "Next: ");
			if (fail_object->next && fail_object->next->kind) {
				file_putf(fff, "%s\n", fail_object->next->kind->name);
			} else {
				file_putf(fff, "bad object\n");
			}
		}
		file_putf(fff, "\n");
	}
	if (fail_pile) {
		file_putf(fff, "Guilty pile\n=============\n");
		while (fail_pile) {
			if (fail_pile->kind) {
				file_putf(fff, "Name: %s\n", fail_pile->kind->name);
			} else {
				file_putf(fff, "bad object\n");
			}
			fail_pile = fail_pile->next;
		}
	}
}